

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O0

Variant * __thiscall cali::Variant::min(Variant *this,Variant *val)

{
  cali_attr_type cVar1;
  cali_attr_type cVar2;
  double *pdVar3;
  long *plVar4;
  unsigned_long *puVar5;
  uint64_t local_38;
  int64_t local_30;
  double local_28;
  cali_attr_type local_1c;
  Variant *pVStack_18;
  cali_attr_type type;
  Variant *val_local;
  Variant *this_local;
  
  pVStack_18 = val;
  val_local = this;
  cVar1 = Variant::type(this);
  local_1c = cVar1;
  cVar2 = Variant::type(pVStack_18);
  if (cVar1 == cVar2) {
    if (local_1c == CALI_TYPE_INT) {
      plVar4 = std::min<long>(&(this->m_v).value.v_int,&(pVStack_18->m_v).value.v_int);
      (this->m_v).value.v_int = *plVar4;
    }
    else if (local_1c == CALI_TYPE_UINT) {
      puVar5 = std::min<unsigned_long>(&(this->m_v).value.v_uint,&(pVStack_18->m_v).value.v_uint);
      (this->m_v).value.v_uint = *puVar5;
    }
    else if (local_1c == CALI_TYPE_DOUBLE) {
      pdVar3 = std::min<double>(&(this->m_v).value.v_double,&(pVStack_18->m_v).value.v_double);
      (this->m_v).value.v_double = *pdVar3;
    }
  }
  else {
    switch(local_1c) {
    case CALI_TYPE_INV:
      (this->m_v).type_and_size = (pVStack_18->m_v).type_and_size;
      (this->m_v).value = (pVStack_18->m_v).value;
      break;
    default:
      break;
    case CALI_TYPE_INT:
      local_30 = to_int64(pVStack_18,(bool *)0x0);
      plVar4 = std::min<long>(&(this->m_v).value.v_int,&local_30);
      (this->m_v).value.v_int = *plVar4;
      break;
    case CALI_TYPE_UINT:
      local_38 = to_uint(pVStack_18,(bool *)0x0);
      puVar5 = std::min<unsigned_long>(&(this->m_v).value.v_uint,&local_38);
      (this->m_v).value.v_uint = *puVar5;
      break;
    case CALI_TYPE_DOUBLE:
      local_28 = to_double(pVStack_18,(bool *)0x0);
      pdVar3 = std::min<double>(&(this->m_v).value.v_double,&local_28);
      (this->m_v).value.v_double = *pdVar3;
    }
  }
  return this;
}

Assistant:

Variant& Variant::min(const Variant& val)
{
    cali_attr_type type = this->type();

    if (type == val.type()) {
        switch (type) {
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.m_v.value.v_double);
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.m_v.value.v_int);
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.m_v.value.v_uint);
            break;
        default:
            break;
        }
    } else {
        switch (type) {
        case CALI_TYPE_INV:
            *this = val;
            break;
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.to_double());
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.to_int64());
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.to_uint());
            break;
        default:
            break;
        }
    }

    return *this;
}